

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall duckdb::JoinHashTable::ProbeSpill::Finalize(ProbeSpill *this)

{
  pointer puVar1;
  reference this_00;
  pointer pPVar2;
  reference this_01;
  type state;
  type other;
  idx_t i;
  ulong __n;
  pointer this_02;
  vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_true>
  *__range1;
  
  for (__n = 0; __n < (ulong)((long)(this->local_partition_append_states).
                                    super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->local_partition_append_states).
                                    super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    this_00 = vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_true>
              ::get<true>(&this->local_partitions,__n);
    pPVar2 = unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>
             ::operator->(this_00);
    this_01 = vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_true>
              ::get<true>(&this->local_partition_append_states,__n);
    state = unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>
            ::operator*(this_01);
    PartitionedColumnData::FlushAppendState(pPVar2,state);
  }
  puVar1 = (this->local_partitions).
           super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (this->local_partitions).
                 super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1; this_02 = this_02 + 1
      ) {
    pPVar2 = unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>
             ::operator->(&this->global_partitions);
    other = unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>
            ::operator*(this_02);
    PartitionedColumnData::Combine(pPVar2,other);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
  ::clear(&(this->local_partitions).
           super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
         );
  ::std::
  vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
  ::clear(&(this->local_partition_append_states).
           super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
         );
  return;
}

Assistant:

void ProbeSpill::Finalize() {
	D_ASSERT(local_partitions.size() == local_partition_append_states.size());
	for (idx_t i = 0; i < local_partition_append_states.size(); i++) {
		local_partitions[i]->FlushAppendState(*local_partition_append_states[i]);
	}
	for (auto &local_partition : local_partitions) {
		global_partitions->Combine(*local_partition);
	}
	local_partitions.clear();
	local_partition_append_states.clear();
}